

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int capacity;
  int nace;
  int nevi;
  ostream *poVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  allocator local_15f5;
  allocator local_15f4;
  allocator local_15f3;
  allocator local_15f2;
  allocator local_15f1;
  ulong local_15f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15e8;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438;
  CircuitOramOpt oram;
  
  std::__cxx11::string::string((string *)&oram,argv[1],(allocator *)&counter);
  iVar1 = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  std::__cxx11::string::string((string *)&oram,argv[2],(allocator *)&counter);
  capacity = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  std::__cxx11::string::string((string *)&oram,argv[3],(allocator *)&counter);
  nace = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  std::__cxx11::string::string((string *)&oram,argv[4],(allocator *)&counter);
  nevi = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  CircuitOramOpt::CircuitOramOpt(&oram,iVar1,capacity,nace,nevi);
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &counter._M_t._M_impl.super__Rb_tree_header._M_header;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  counter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       counter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting warmming up with ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x100000);
  poVar2 = std::operator<<(poVar2," operations.");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar6 = (long)(1 << ((byte)iVar1 & 0x1f));
  lVar5 = 0x100000;
  if (0x100000 < lVar6) {
    lVar5 = lVar6;
  }
  for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
    CircuitOramOpt::access(&oram,(char *)(lVar7 % lVar6 & 0xffffffff),(int)(lVar7 % lVar6));
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Warmup completed.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_15f0 = 1;
  lVar5 = 0;
  do {
    uVar3 = local_15f0 / 1000000;
    iVar1 = CircuitOramOpt::access(&oram,(char *)(lVar5 % lVar6 & 0xffffffff),(int)(lVar5 % lVar6));
    if ((char)iVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"tree oram invariance is broken");
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    iVar1 = TreeOram::stash_size((TreeOram *)&oram);
    local_15e8._M_dataplus._M_p = (pointer)(long)iVar1;
    pmVar4 = std::
             map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             ::operator[](&counter,(key_type *)&local_15e8);
    *pmVar4 = *pmVar4 + 1;
    if (uVar3 * 1000000 + -1 == lVar5) {
      std::__cxx11::string::string((string *)&local_14b8,"circuit_opt",&local_15f1);
      std::operator+(&local_1598,&local_14b8,"_");
      std::__cxx11::string::string((string *)&local_14d8,argv[1],&local_15f2);
      std::operator+(&local_1498,&local_1598,&local_14d8);
      std::operator+(&local_1578,&local_1498,"_");
      std::__cxx11::string::string((string *)&local_14f8,argv[2],&local_15f3);
      std::operator+(&local_1458,&local_1578,&local_14f8);
      std::operator+(&local_1558,&local_1458,"_");
      std::__cxx11::string::string((string *)&local_1518,argv[3],&local_15f4);
      std::operator+(&local_1478,&local_1558,&local_1518);
      std::operator+(&local_15e8,&local_1478,"_");
      std::__cxx11::string::string((string *)&local_1538,argv[4],&local_15f5);
      std::operator+(&local_1438,&local_15e8,&local_1538);
      pruint64_t(lVar5 + 1,&counter,&local_1438);
      std::__cxx11::string::~string((string *)&local_1438);
      std::__cxx11::string::~string((string *)&local_1538);
      std::__cxx11::string::~string((string *)&local_15e8);
      std::__cxx11::string::~string((string *)&local_1478);
      std::__cxx11::string::~string((string *)&local_1518);
      std::__cxx11::string::~string((string *)&local_1558);
      std::__cxx11::string::~string((string *)&local_1458);
      std::__cxx11::string::~string((string *)&local_14f8);
      std::__cxx11::string::~string((string *)&local_1578);
      std::__cxx11::string::~string((string *)&local_1498);
      std::__cxx11::string::~string((string *)&local_14d8);
      std::__cxx11::string::~string((string *)&local_1598);
      std::__cxx11::string::~string((string *)&local_14b8);
    }
    local_15f0 = local_15f0 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   int access = stoi(string(argv[3]));
   int evict = stoi(string(argv[4]));
      
   long long N = (1<<logN);
   CircuitOramOpt oram(logN, cap, access, evict);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("circuit_opt")+"_"+string(argv[1])+"_"+string(argv[2])+"_"+string(argv[3])+"_"+string(argv[4]));
   }
}